

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCascade.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkBddDec(Abc_Ntk_t *pNtk,int fVerbose)

{
  int *piVar1;
  int iVar2;
  DdManager *dd;
  Vec_Ptr_t *pVVar3;
  void *__ptr;
  undefined8 uVar4;
  reo_man *p;
  DdNode *pDVar5;
  Abc_Ntk_t *pAVar6;
  int iVar7;
  DdNode **pbVars;
  int iVar8;
  char *format;
  reo_man *pReo;
  long lVar9;
  long lVar10;
  DdNode *pFuncs [256];
  DdNode *local_838 [257];
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                  ,0x3f3,"Abc_Ntk_t *Abc_NtkBddDec(Abc_Ntk_t *, int)");
  }
  if (0x100 < pNtk->vCos->nSize) {
    __assert_fail("Abc_NtkCoNum(pNtk) <= BDD_FUNC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                  ,0x3f4,"Abc_Ntk_t *Abc_NtkBddDec(Abc_Ntk_t *, int)");
  }
  format = (char *)0xf4240;
  iVar7 = 1;
  pAVar6 = pNtk;
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,1000000,0,1,fVerbose);
  if (dd == (DdManager *)0x0) {
    Abc_Print((int)pAVar6,format);
    pAVar6 = (Abc_Ntk_t *)0x0;
  }
  else {
    pVVar3 = pNtk->vCos;
    if (pVVar3->nSize < 1) {
      iVar8 = dd->size;
      if (iVar8 != pNtk->vCis->nSize) goto LAB_00241f4d;
    }
    else {
      lVar9 = 0;
      do {
        lVar10 = *(long *)(*pVVar3->pArray[lVar9] + 0x1b0);
        if (*(int *)(lVar10 + 4) < 8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        piVar1 = *(int **)(*(long *)(lVar10 + 8) + 0x38);
        __ptr = *(void **)(piVar1 + 2);
        if (__ptr == (void *)0x0) {
          __assert_fail("p->pArrayPtr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecAtt.h"
                        ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
        }
        iVar7 = (int)*(long *)((long)pVVar3->pArray[lVar9] + 0x10);
        lVar10 = (long)iVar7;
        iVar8 = *piVar1;
        if (iVar8 <= iVar7) {
          iVar2 = iVar7 + 10;
          if (iVar7 < iVar8 * 2) {
            iVar2 = iVar8 * 2;
          }
          if (iVar8 < iVar2) {
            __ptr = realloc(__ptr,(long)iVar2 * 8);
            *(void **)(piVar1 + 2) = __ptr;
            memset((void *)((long)__ptr + (long)*piVar1 * 8),0,((long)iVar2 - (long)*piVar1) * 8);
            *piVar1 = iVar2;
          }
        }
        pDVar5 = *(DdNode **)((long)__ptr + lVar10 * 8);
        if (pDVar5 == (DdNode *)0x0) {
          if (*(code **)(piVar1 + 8) == (code *)0x0) {
            pDVar5 = (DdNode *)0x0;
          }
          else {
            uVar4 = (**(code **)(piVar1 + 8))(*(undefined8 *)(piVar1 + 4));
            *(undefined8 *)(*(long *)(piVar1 + 2) + lVar10 * 8) = uVar4;
            pDVar5 = *(DdNode **)(*(long *)(piVar1 + 2) + lVar10 * 8);
          }
        }
        local_838[lVar9] = pDVar5;
        lVar9 = lVar9 + 1;
        pVVar3 = pNtk->vCos;
        iVar7 = pVVar3->nSize;
        lVar10 = (long)iVar7;
      } while (lVar9 < lVar10);
      iVar8 = dd->size;
      if (iVar8 != pNtk->vCis->nSize) {
LAB_00241f4d:
        __assert_fail("dd->size == Abc_NtkCiNum(pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCascade.c"
                      ,0x400,"Abc_Ntk_t *Abc_NtkBddDec(Abc_Ntk_t *, int)");
      }
      if (0 < iVar7) {
        iVar8 = 0;
        do {
          Cudd_addNewVarAtLevel(dd,dd->size);
          iVar7 = (int)lVar10;
          iVar8 = iVar8 + 1;
        } while (iVar8 < pNtk->vCos->nSize);
        iVar8 = pNtk->vCis->nSize;
      }
    }
    p = Extra_ReorderInit(iVar8,1000);
    Extra_ReorderSetMinimizationType(p,REO_MINIMIZE_WIDTH);
    Extra_ReorderSetVerification(p,1);
    pReo = p;
    Extra_ReorderSetVerbosity(p,1);
    pDVar5 = Abc_NtkBddDecInt(pReo,dd,local_838,iVar7,pNtk->vCos->nSize);
    Cudd_Ref(pDVar5);
    Extra_ReorderQuit(p);
    Abc_NtkExploreCofs(dd,pDVar5,pbVars,pNtk->vCis->nSize,6);
    pAVar6 = Abc_NtkDup(pNtk);
    Cudd_RecursiveDeref(dd,pDVar5);
    Abc_NtkFreeGlobalBdds(pNtk,1);
  }
  return pAVar6;
}

Assistant:

Abc_Ntk_t * Abc_NtkBddDec( Abc_Ntk_t * pNtk, int fVerbose )
{
    int nBddSizeMax   = 1000000;
    int fDropInternal =       0;
    int fReorder      =       1;
    Abc_Ntk_t * pNtkNew;
    reo_man * pReo;
    DdManager * dd;
    DdNode * pFuncs[BDD_FUNC_MAX];
    DdNode * bFunc;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkCoNum(pNtk) <= BDD_FUNC_MAX );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, nBddSizeMax, fDropInternal, fReorder, fVerbose );
    if ( dd == NULL )
    {
        Abc_Print( -1, "Construction of global BDDs has failed.\n" );
        return NULL;
    }
    // collect global BDDs
    Abc_NtkForEachCo( pNtk, pNode, i )
        pFuncs[i] = (DdNode *)Abc_ObjGlobalBdd(pNode);

    // create new variables at the bottom
    assert( dd->size == Abc_NtkCiNum(pNtk) );
    for ( i = 0; i < Abc_NtkCoNum(pNtk); i++ )
        Cudd_addNewVarAtLevel( dd, dd->size );

    // prepare reordering engine
    pReo = Extra_ReorderInit( Abc_NtkCiNum(pNtk), 1000 );
    Extra_ReorderSetMinimizationType( pReo, REO_MINIMIZE_WIDTH );
    Extra_ReorderSetVerification( pReo, 1 );
    Extra_ReorderSetVerbosity( pReo, 1 );

    // derive characteristic function
    bFunc = Abc_NtkBddDecInt( pReo, dd, pFuncs, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk) );  Cudd_Ref( bFunc );
    Extra_ReorderQuit( pReo );

Abc_NtkExploreCofs( dd, bFunc, dd->vars, Abc_NtkCiNum(pNtk), 6 );

    // create new network
//    pNtkNew = Abc_NtkCreateFromCharFunc( pNtk, dd, bFunc );
    pNtkNew = Abc_NtkDup( pNtk );

    // cleanup
    Cudd_RecursiveDeref( dd, bFunc );
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    return pNtkNew;
}